

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

void __thiscall leveldb::Version::~Version(Version *this)

{
  int iVar1;
  Version *pVVar2;
  Version *pVVar3;
  FileMetaData *pFVar4;
  pointer pcVar5;
  void *pvVar6;
  pointer ppFVar7;
  pointer ppFVar8;
  ulong uVar9;
  long lVar10;
  
  if (this->refs_ != 0) {
    __assert_fail("refs_ == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set.cc"
                  ,0x45,"leveldb::Version::~Version()");
  }
  pVVar2 = this->next_;
  pVVar3 = this->prev_;
  pVVar3->next_ = pVVar2;
  pVVar2->prev_ = pVVar3;
  lVar10 = 0;
  do {
    ppFVar7 = this->files_[lVar10].
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppFVar8 = this->files_[lVar10].
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar8 != ppFVar7) {
      uVar9 = 0;
      do {
        pFVar4 = ppFVar7[uVar9];
        iVar1 = pFVar4->refs;
        if (iVar1 < 1) {
          __assert_fail("f->refs > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set.cc"
                        ,0x4f,"leveldb::Version::~Version()");
        }
        pFVar4->refs = iVar1 + -1;
        if (iVar1 == 1) {
          pcVar5 = (pFVar4->largest).rep_._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar5 != &(pFVar4->largest).rep_.field_2) {
            operator_delete(pcVar5);
          }
          pcVar5 = (pFVar4->smallest).rep_._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar5 != &(pFVar4->smallest).rep_.field_2) {
            operator_delete(pcVar5);
          }
          operator_delete(pFVar4);
          ppFVar7 = this->files_[lVar10].
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppFVar8 = this->files_[lVar10].
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < (ulong)((long)ppFVar8 - (long)ppFVar7 >> 3));
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 7);
  lVar10 = 0xb0;
  do {
    pvVar6 = *(void **)((long)this->files_ + lVar10 + -0x20);
    if (pvVar6 != (void *)0x0) {
      operator_delete(pvVar6);
    }
    lVar10 = lVar10 + -0x18;
  } while (lVar10 != 8);
  return;
}

Assistant:

Version::~Version() {
  assert(refs_ == 0);

  // Remove from linked list
  prev_->next_ = next_;
  next_->prev_ = prev_;

  // Drop references to files
  for (int level = 0; level < config::kNumLevels; level++) {
    for (size_t i = 0; i < files_[level].size(); i++) {
      FileMetaData* f = files_[level][i];
      assert(f->refs > 0);
      f->refs--;
      if (f->refs <= 0) {
        delete f;
      }
    }
  }
}